

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

int run_test_fs_readdir_non_existing_dir(void)

{
  char *__s1;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  uv_fs_t *req;
  long lVar3;
  uv_fs_t uStack_8f8;
  uv_loop_t *puStack_740;
  uv_fs_t uStack_730;
  undefined1 auStack_578 [880];
  uv_fs_t uStack_208;
  uv_loop_t *puStack_50;
  
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",(uv_fs_cb)0x0);
  if (iVar1 == -2) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00158099;
    if (opendir_req.result != -2) goto LAB_0015809e;
    if (opendir_req.ptr != (void *)0x0) goto LAB_001580a3;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    if (iVar1 != 0) goto LAB_001580a8;
    if (non_existing_opendir_cb_count != 0) goto LAB_001580ad;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001580b2;
    if (non_existing_opendir_cb_count != 1) goto LAB_001580b7;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_00158099:
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0015809e:
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_001580a3:
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_001580a8:
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_001580ad:
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_001580b2:
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_001580b7:
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar2 == (uv_loop_t *)&opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00158104;
    if (opendir_req.result != -2) goto LAB_00158109;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_00158104:
    non_existing_opendir_cb_cold_2();
LAB_00158109:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",(uv_fs_cb)0x0);
  if (iVar1 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015821d;
    if (opendir_req.result != -0x14) goto LAB_00158222;
    if (opendir_req.ptr != (void *)0x0) goto LAB_00158227;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar1 != 0) goto LAB_0015822c;
    if (file_opendir_cb_count != 0) goto LAB_00158231;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00158236;
    if (file_opendir_cb_count != 1) goto LAB_0015823b;
    loop = (uv_fs_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0015821d:
    run_test_fs_readdir_file_cold_2();
LAB_00158222:
    run_test_fs_readdir_file_cold_3();
LAB_00158227:
    run_test_fs_readdir_file_cold_4();
LAB_0015822c:
    run_test_fs_readdir_file_cold_5();
LAB_00158231:
    run_test_fs_readdir_file_cold_6();
LAB_00158236:
    run_test_fs_readdir_file_cold_7();
LAB_0015823b:
    loop = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar2 == (uv_loop_t *)&opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00158288;
    if (opendir_req.result != -0x14) goto LAB_0015828d;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_00158288:
    file_opendir_cb_cold_2();
LAB_0015828d:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_740 = (uv_loop_t *)0x1582ad;
  puStack_50 = (uv_loop_t *)loop;
  cleanup_test_files();
  puStack_740 = (uv_loop_t *)0x1582b2;
  puVar2 = uv_default_loop();
  puStack_740 = (uv_loop_t *)0x1582d1;
  iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(auStack_578 + 0x1b8),"test_dir",0x1ed,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    puStack_740 = (uv_loop_t *)0x1582de;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x158303;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)auStack_578,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    req = loop;
    if (iVar1 < 0) goto LAB_001586a9;
    req = (uv_fs_t *)auStack_578;
    puStack_740 = (uv_loop_t *)0x15831b;
    uv_fs_req_cleanup(req);
    puStack_740 = (uv_loop_t *)0x158320;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x158332;
    iVar1 = uv_fs_close(puVar2,&uStack_730,auStack_578._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586ae;
    puStack_740 = (uv_loop_t *)0x158344;
    uv_fs_req_cleanup(&uStack_730);
    puStack_740 = (uv_loop_t *)0x158349;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x15836e;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)auStack_578,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_001586b3;
    req = (uv_fs_t *)auStack_578;
    puStack_740 = (uv_loop_t *)0x158386;
    uv_fs_req_cleanup(req);
    puStack_740 = (uv_loop_t *)0x15838b;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x15839d;
    iVar1 = uv_fs_close(puVar2,&uStack_730,auStack_578._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586b8;
    puStack_740 = (uv_loop_t *)0x1583af;
    uv_fs_req_cleanup(&uStack_730);
    puStack_740 = (uv_loop_t *)0x1583b4;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x1583d3;
    iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(auStack_578 + 0x1b8),"test_dir/test_subdir",0x1ed,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586bd;
    puStack_740 = (uv_loop_t *)0x1583e8;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_578 + 0x1b8));
    req = &opendir_req;
    puStack_740 = (uv_loop_t *)0x158401;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_740 = (uv_loop_t *)0x158406;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x15841a;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
    loop = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_001586c2;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_001586c7;
    if (opendir_req.result != 0) goto LAB_001586cc;
    if (opendir_req.ptr == (void *)0x0) goto LAB_001586d1;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)loop + 8) = 1;
    puStack_740 = (uv_loop_t *)0x15846b;
    uv_fs_req_cleanup(&opendir_req);
    puStack_740 = (uv_loop_t *)0x158470;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x158484;
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
LAB_0015869f:
      puStack_740 = (uv_loop_t *)0x1586a4;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_001586a4;
    }
    lVar3 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_740 = (uv_loop_t *)0x1584b9;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_740 = (uv_loop_t *)0x1584cc;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_001584e3;
        puStack_740 = (uv_loop_t *)0x1584db;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_001584e3;
LAB_00158695:
        puStack_740 = (uv_loop_t *)0x15869a;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015869a:
        puStack_740 = (uv_loop_t *)0x15869f;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015869f;
      }
LAB_001584e3:
      puStack_740 = (uv_loop_t *)0x1584ee;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015850b;
        goto LAB_0015869a;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_740 = (uv_loop_t *)0x158695;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_00158695;
      }
LAB_0015850b:
      puStack_740 = (uv_loop_t *)0x158513;
      uv_fs_req_cleanup(&readdir_req);
      puStack_740 = (uv_loop_t *)0x158518;
      puVar2 = uv_default_loop();
      puStack_740 = (uv_loop_t *)0x158528;
      iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    if (lVar3 != 0) goto LAB_0015869f;
    puStack_740 = (uv_loop_t *)0x158548;
    uv_fs_req_cleanup(&readdir_req);
    puStack_740 = (uv_loop_t *)0x158561;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_740 = (uv_loop_t *)0x158566;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x158576;
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
    if (closedir_req.result != 0) goto LAB_001586d6;
    puStack_740 = (uv_loop_t *)0x158590;
    uv_fs_req_cleanup(&closedir_req);
    loop = &opendir_req;
    puStack_740 = (uv_loop_t *)0x1585a9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_740 = (uv_loop_t *)0x1585ae;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x1585c7;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_001586db;
    if (non_empty_opendir_cb_count != 0) goto LAB_001586e0;
    if (non_empty_closedir_cb_count != 0) goto LAB_001586e5;
    puStack_740 = (uv_loop_t *)0x1585ee;
    puVar2 = uv_default_loop();
    puStack_740 = (uv_loop_t *)0x1585f8;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001586ea;
    if (non_empty_opendir_cb_count != 1) goto LAB_001586ef;
    if (non_empty_closedir_cb_count == 1) {
      puStack_740 = (uv_loop_t *)0x15861f;
      puVar2 = uv_default_loop();
      puStack_740 = (uv_loop_t *)0x15863b;
      uv_fs_rmdir(puVar2,&uStack_208,"test_subdir",(uv_fs_cb)0x0);
      puStack_740 = (uv_loop_t *)0x158643;
      uv_fs_req_cleanup(&uStack_208);
      puStack_740 = (uv_loop_t *)0x158648;
      cleanup_test_files();
      puStack_740 = (uv_loop_t *)0x15864d;
      loop = (uv_fs_t *)uv_default_loop();
      puStack_740 = (uv_loop_t *)0x158661;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_740 = (uv_loop_t *)0x15866b;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puStack_740 = (uv_loop_t *)0x158670;
      puVar2 = uv_default_loop();
      puStack_740 = (uv_loop_t *)0x158678;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001586f9;
    }
  }
  else {
LAB_001586a4:
    puStack_740 = (uv_loop_t *)0x1586a9;
    run_test_fs_readdir_non_empty_dir_cold_1();
    req = loop;
LAB_001586a9:
    puStack_740 = (uv_loop_t *)0x1586ae;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_001586ae:
    puStack_740 = (uv_loop_t *)0x1586b3;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_001586b3:
    puStack_740 = (uv_loop_t *)0x1586b8;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_001586b8:
    puStack_740 = (uv_loop_t *)0x1586bd;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_001586bd:
    puStack_740 = (uv_loop_t *)0x1586c2;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_001586c2:
    puStack_740 = (uv_loop_t *)0x1586c7;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_001586c7:
    puStack_740 = (uv_loop_t *)0x1586cc;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_001586cc:
    loop = req;
    puStack_740 = (uv_loop_t *)0x1586d1;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_001586d1:
    puStack_740 = (uv_loop_t *)0x1586d6;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_001586d6:
    puStack_740 = (uv_loop_t *)0x1586db;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_001586db:
    puStack_740 = (uv_loop_t *)0x1586e0;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_001586e0:
    puStack_740 = (uv_loop_t *)0x1586e5;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_001586e5:
    puStack_740 = (uv_loop_t *)0x1586ea;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_001586ea:
    puStack_740 = (uv_loop_t *)0x1586ef;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_001586ef:
    puStack_740 = (uv_loop_t *)0x1586f4;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_740 = (uv_loop_t *)0x1586f9;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_001586f9:
  puStack_740 = (uv_loop_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_740 = (uv_loop_t *)loop;
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_8f8,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8f8);
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_8f8,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8f8);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_8f8,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8f8);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_8f8,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8f8);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == UV_ENOENT);
  ASSERT(opendir_req.ptr == NULL);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}